

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.h
# Opt level: O0

void __thiscall HEkk::~HEkk(HEkk *this)

{
  HSimplexNla *in_RDI;
  HighsSimplexAnalysis *unaff_retaddr;
  
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>::
  ~vector((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  HighsRayRecord::~HighsRayRecord((HighsRayRecord *)0x43eff8);
  HighsRayRecord::~HighsRayRecord((HighsRayRecord *)0x43f009);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  HotStart::~HotStart((HotStart *)in_RDI);
  HSimplexNla::~HSimplexNla(in_RDI);
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_RDI);
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  HighsHashTable<unsigned_long,_void>::~HighsHashTable
            ((HighsHashTable<unsigned_long,_void> *)in_RDI);
  SimplexBasis::~SimplexBasis((SimplexBasis *)in_RDI);
  HighsSimplexInfo::~HighsSimplexInfo((HighsSimplexInfo *)in_RDI);
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[3].factor_.mr_count_before.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  HighsLp::~HighsLp((HighsLp *)in_RDI);
  HighsSimplexAnalysis::~HighsSimplexAnalysis(unaff_retaddr);
  return;
}

Assistant:

HEkk()
      : callback_(nullptr),
        options_(nullptr),
        timer_(nullptr),
        lp_name_(""),
        model_status_(HighsModelStatus::kNotset),
        simplex_in_scaled_space_(false),
        cost_scale_(1.0),
        cost_perturbation_base_(0.0),
        cost_perturbation_max_abs_cost_(0.0),
        iteration_count_(0),
        dual_simplex_cleanup_level_(0),
        dual_simplex_phase1_cleanup_level_(0),
        previous_iteration_cycling_detected(-kHighsIInf),
        solve_bailout_(false),
        called_return_from_solve_(false),
        exit_algorithm_(SimplexAlgorithm::kNone),
        return_primal_solution_status_(0),
        return_dual_solution_status_(0),
        original_num_col_(0),
        original_num_row_(0),
        original_num_nz_(0),
        original_offset_(0.0),
        edge_weight_error_(0.0),
        build_synthetic_tick_(0.0),
        total_synthetic_tick_(0.0),
        debug_solve_call_num_(0),
        debug_basis_id_(0),
        time_report_(false),
        debug_initial_build_synthetic_tick_(0),
        debug_solve_report_(false),
        debug_iteration_report_(false),
        debug_basis_report_(false),
        debug_dual_feasible(false),
        debug_max_relative_dual_steepest_edge_weight_error(0) {}